

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O2

bool Assimp::Q3Shader::LoadShader(ShaderData *fill,string *pFile,IOSystem *io)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  bool bVar3;
  int iVar4;
  BlendFunc BVar5;
  undefined4 extraout_var;
  Logger *pLVar7;
  long lVar8;
  _List_node_base *p_Var9;
  undefined4 uVar10;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **in;
  char **in_00;
  char **in_01;
  char **in_02;
  char **in_03;
  char *buff;
  _List_node_base *local_200;
  long *local_1f8;
  vector<char,_std::allocator<char>_> _buff;
  string local_1c8;
  string blend_src;
  _List_node_base local_180;
  size_t local_170;
  long *plVar6;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&blend_src,"rt",(allocator<char> *)&local_1c8);
  iVar4 = (*io->_vptr_IOSystem[4])(io,(pFile->_M_dataplus)._M_p,blend_src._M_dataplus._M_p);
  plVar6 = (long *)CONCAT44(extraout_var,iVar4);
  std::__cxx11::string::~string((string *)&blend_src);
  if (plVar6 != (long *)0x0) {
    local_1f8 = plVar6;
    pLVar7 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[28]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&blend_src,
               (char (*) [28])"Loading Quake3 shader file ");
    std::operator<<((ostream *)&blend_src,(string *)pFile);
    std::__cxx11::stringbuf::str();
    Logger::info(pLVar7,local_1c8._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&blend_src);
    lVar8 = (**(code **)(*local_1f8 + 0x30))();
    std::vector<char,_std::allocator<char>_>::vector(&_buff,lVar8 + 1,(allocator_type *)&blend_src);
    (**(code **)(*local_1f8 + 0x10))
              (local_1f8,
               _buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
               ._M_start,lVar8,1);
    _buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
    [lVar8] = '\0';
    CommentRemover::RemoveLineComments
              ("//",_buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,' ');
    buff = _buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
    local_200 = (_List_node_base *)0x0;
    while( true ) {
      bVar3 = SkipSpacesAndLineEnd<char>(&buff);
      if (!bVar3) break;
      if (*buff == '{') {
        buff = buff + 1;
        if (local_200 == (_List_node_base *)0x0) {
          pLVar7 = DefaultLogger::get();
          Logger::error(pLVar7,"Q3Shader: Unexpected shader section token \'{\'");
          break;
        }
        p_Var2 = local_200 + 2;
        while( true ) {
          bVar3 = SkipSpacesAndLineEnd<char>(&buff);
          if (!bVar3) break;
          if (*buff == '{') {
            buff = buff + 1;
            blend_src._M_dataplus._M_p = (pointer)&blend_src.field_2;
            blend_src._M_string_length = 0;
            blend_src.field_2._M_local_buf[0] = '\0';
            local_180._M_next = (_List_node_base *)((ulong)local_180._M_next & 0xffffffff00000000);
            std::__cxx11::
            list<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>
            ::push_back((list<Assimp::Q3Shader::ShaderMapBlock,_std::allocator<Assimp::Q3Shader::ShaderMapBlock>_>
                         *)&p_Var2->_M_prev,(value_type *)&blend_src);
            std::__cxx11::string::~string((string *)&blend_src);
            p_Var1 = local_200[3]._M_next;
            while( true ) {
              bVar3 = SkipSpacesAndLineEnd<char>(&buff);
              if (!bVar3) break;
              bVar3 = TokenMatchI(&buff,"map",3);
              in = extraout_RDX;
              if (bVar3) {
LAB_00417e79:
                GetNextToken_abi_cxx11_(&blend_src,(Assimp *)&buff,in);
                std::__cxx11::string::operator=((string *)(p_Var1 + 1),(string *)&blend_src);
LAB_00417e8f:
                std::__cxx11::string::~string((string *)&blend_src);
              }
              else {
                bVar3 = TokenMatchI(&buff,"clampmap",8);
                in = extraout_RDX_00;
                if (bVar3) goto LAB_00417e79;
                bVar3 = TokenMatchI(&buff,"blendfunc",9);
                if (bVar3) {
                  GetNextToken_abi_cxx11_(&blend_src,(Assimp *)&buff,in_00);
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&blend_src,"add");
                  if (bVar3) {
                    p_Var9 = (_List_node_base *)0x100000001;
                  }
                  else {
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&blend_src,"filter");
                    if (bVar3) {
                      p_Var9 = (_List_node_base *)0x200000003;
                    }
                    else {
                      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&blend_src,"blend");
                      if (!bVar3) {
                        BVar5 = StringToBlendFunc(&blend_src);
                        *(BlendFunc *)&p_Var1[3]._M_next = BVar5;
                        GetNextToken_abi_cxx11_(&local_1c8,(Assimp *)&buff,in_02);
                        BVar5 = StringToBlendFunc(&local_1c8);
                        *(BlendFunc *)((long)&p_Var1[3]._M_next + 4) = BVar5;
                        std::__cxx11::string::~string((string *)&local_1c8);
                        goto LAB_00417e8f;
                      }
                      p_Var9 = (_List_node_base *)0x600000005;
                    }
                  }
                  p_Var1[3]._M_next = p_Var9;
                  goto LAB_00417e8f;
                }
                bVar3 = TokenMatchI(&buff,"alphafunc",9);
                if (bVar3) {
                  GetNextToken_abi_cxx11_(&blend_src,(Assimp *)&buff,in_01);
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&blend_src,"GT0");
                  uVar10 = 1;
                  if (!bVar3) {
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&blend_src,"LT128");
                    uVar10 = 2;
                    if (!bVar3) {
                      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&blend_src,"GE128");
                      uVar10 = 3;
                      if (!bVar3) goto LAB_00417e8f;
                    }
                  }
                  *(undefined4 *)&p_Var1[3]._M_prev = uVar10;
                  goto LAB_00417e8f;
                }
                if (*buff == '}') {
                  buff = buff + 1;
                  break;
                }
              }
              SkipLine<char>(&buff);
            }
          }
          else {
            if (*buff == '}') {
              buff = buff + 1;
              local_200 = (_List_node_base *)0x0;
              break;
            }
            bVar3 = TokenMatchI(&buff,"cull",4);
            if (bVar3) {
              SkipSpaces<char>(&buff);
              iVar4 = ASSIMP_strincmp(buff,"back",4);
              if (iVar4 == 0) {
                *(undefined4 *)&local_200[2]._M_next = 2;
              }
              else {
                iVar4 = ASSIMP_strincmp(buff,"front",5);
                if (iVar4 == 0) {
                  *(undefined4 *)&local_200[2]._M_next = 1;
                }
                else {
                  iVar4 = ASSIMP_strincmp(buff,"none",4);
                  if (iVar4 != 0) {
                    iVar4 = ASSIMP_strincmp(buff,"disable",7);
                    if (iVar4 != 0) {
                      pLVar7 = DefaultLogger::get();
                      Logger::error(pLVar7,"Q3Shader: Unrecognized cull mode");
                      goto LAB_0041800e;
                    }
                  }
                  *(undefined4 *)&local_200[2]._M_next = 0;
                }
              }
            }
          }
LAB_0041800e:
          SkipLine<char>(&buff);
        }
      }
      else {
        blend_src._M_dataplus._M_p = (pointer)&blend_src.field_2;
        blend_src._M_string_length = 0;
        blend_src.field_2._M_local_buf[0] = '\0';
        local_180._M_next = &local_180;
        local_170 = 0;
        local_180._M_prev = local_180._M_next;
        std::__cxx11::
        list<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
        ::push_back(&fill->blocks,(ShaderDataBlock *)&blend_src);
        ShaderDataBlock::~ShaderDataBlock((ShaderDataBlock *)&blend_src);
        p_Var2 = (fill->blocks).
                 super__List_base<Assimp::Q3Shader::ShaderDataBlock,_std::allocator<Assimp::Q3Shader::ShaderDataBlock>_>
                 ._M_impl._M_node.super__List_node_base._M_prev;
        GetNextToken_abi_cxx11_(&blend_src,(Assimp *)&buff,in_03);
        local_200 = p_Var2 + 1;
        std::__cxx11::string::operator=((string *)local_200,(string *)&blend_src);
        std::__cxx11::string::~string((string *)&blend_src);
      }
      SkipLine<char>(&buff);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&_buff.super__Vector_base<char,_std::allocator<char>_>);
    plVar6 = local_1f8;
    (**(code **)(*local_1f8 + 8))(local_1f8);
  }
  return plVar6 != (long *)0x0;
}

Assistant:

bool Q3Shader::LoadShader(ShaderData& fill, const std::string& pFile,IOSystem* io)
{
    std::unique_ptr<IOStream> file( io->Open( pFile, "rt"));
    if (!file.get())
        return false; // if we can't access the file, don't worry and return

    ASSIMP_LOG_INFO_F("Loading Quake3 shader file ", pFile);

    // read file in memory
    const size_t s = file->FileSize();
    std::vector<char> _buff(s+1);
    file->Read(&_buff[0],s,1);
    _buff[s] = 0;

    // remove comments from it (C++ style)
    CommentRemover::RemoveLineComments("//",&_buff[0]);
    const char* buff = &_buff[0];

    Q3Shader::ShaderDataBlock* curData = NULL;
    Q3Shader::ShaderMapBlock*  curMap  = NULL;

    // read line per line
    for (;SkipSpacesAndLineEnd(&buff);SkipLine(&buff)) {

        if (*buff == '{') {
            ++buff;

            // append to last section, if any
            if (!curData) {
                ASSIMP_LOG_ERROR("Q3Shader: Unexpected shader section token \'{\'");
                return true; // still no failure, the file is there
            }

            // read this data section
            for (;SkipSpacesAndLineEnd(&buff);SkipLine(&buff)) {
                if (*buff == '{') {
                    ++buff;
                    // add new map section
                    curData->maps.push_back(Q3Shader::ShaderMapBlock());
                    curMap = &curData->maps.back();

                    for (;SkipSpacesAndLineEnd(&buff);SkipLine(&buff)) {
                        // 'map' - Specifies texture file name
                        if (TokenMatchI(buff,"map",3) || TokenMatchI(buff,"clampmap",8)) {
                            curMap->name = GetNextToken(buff);
                        }
                        // 'blendfunc' - Alpha blending mode
                        else if (TokenMatchI(buff,"blendfunc",9)) {
                            const std::string blend_src = GetNextToken(buff);
                            if (blend_src == "add") {
                                curMap->blend_src  = Q3Shader::BLEND_GL_ONE;
                                curMap->blend_dest = Q3Shader::BLEND_GL_ONE;
                            }
                            else if (blend_src == "filter") {
                                curMap->blend_src  = Q3Shader::BLEND_GL_DST_COLOR;
                                curMap->blend_dest = Q3Shader::BLEND_GL_ZERO;
                            }
                            else if (blend_src == "blend") {
                                curMap->blend_src  = Q3Shader::BLEND_GL_SRC_ALPHA;
                                curMap->blend_dest = Q3Shader::BLEND_GL_ONE_MINUS_SRC_ALPHA;
                            }
                            else {
                                curMap->blend_src  = StringToBlendFunc(blend_src);
                                curMap->blend_dest = StringToBlendFunc(GetNextToken(buff));
                            }
                        }
                        // 'alphafunc' - Alpha testing mode
                        else if (TokenMatchI(buff,"alphafunc",9)) {
                            const std::string at = GetNextToken(buff);
                            if (at == "GT0") {
                                curMap->alpha_test = Q3Shader::AT_GT0;
                            }
                            else if (at == "LT128") {
                                curMap->alpha_test = Q3Shader::AT_LT128;
                            }
                            else if (at == "GE128") {
                                curMap->alpha_test = Q3Shader::AT_GE128;
                            }
                        }
                        else if (*buff == '}') {
                            ++buff;
                            // close this map section
                            curMap = NULL;
                            break;
                        }
                    }

                }
                else if (*buff == '}') {
                    ++buff;
                    curData = NULL;
                    break;
                }

                // 'cull' specifies culling behaviour for the model
                else if (TokenMatchI(buff,"cull",4)) {
                    SkipSpaces(&buff);
                    if (!ASSIMP_strincmp(buff,"back",4)) {
                        curData->cull = Q3Shader::CULL_CCW;
                    } else if (!ASSIMP_strincmp(buff,"front",5)) {
                        curData->cull = Q3Shader::CULL_CW;
                    } else if (!ASSIMP_strincmp(buff,"none",4) || !ASSIMP_strincmp(buff,"disable",7)) {
                        curData->cull = Q3Shader::CULL_NONE;
                    } else {
                        ASSIMP_LOG_ERROR("Q3Shader: Unrecognized cull mode");
                    }
                }
            }
        } else {
            // add new section
            fill.blocks.push_back(Q3Shader::ShaderDataBlock());
            curData = &fill.blocks.back();

            // get the name of this section
            curData->name = GetNextToken(buff);
        }
    }
    return true;
}